

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
          *samples,bool logBucketPerformance)

{
  int iVar1;
  UploadSampleAnalyzeResult UVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  string *description;
  TestLog *pTVar6;
  const_reference pvVar7;
  offset_in_SampleType_to_deUint64 in_RCX;
  int numBytes;
  float fVar8;
  undefined1 auVar9 [12];
  pointer *local_1ab8;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  *local_18e8;
  allocator<char> local_18a9;
  string local_18a8;
  allocator<char> local_1881;
  string local_1880;
  allocator<char> local_1859;
  string local_1858;
  LogNumber<float> local_1838;
  allocator<char> local_17c9;
  string local_17c8;
  allocator<char> local_17a1;
  string local_17a0;
  allocator<char> local_1779;
  string local_1778;
  LogNumber<float> local_1758;
  allocator<char> local_16e9;
  string local_16e8;
  allocator<char> local_16c1;
  string local_16c0;
  allocator<char> local_1699;
  string local_1698;
  LogNumber<float> local_1678;
  allocator<char> local_1609;
  string local_1608;
  allocator<char> local_15e1;
  string local_15e0;
  allocator<char> local_15b9;
  string local_15b8;
  LogNumber<float> local_1598;
  allocator<char> local_1529;
  string local_1528;
  allocator<char> local_1501;
  string local_1500;
  allocator<char> local_14d9;
  string local_14d8;
  LogNumber<float> local_14b8;
  allocator<char> local_1449;
  string local_1448;
  allocator<char> local_1421;
  string local_1420;
  allocator<char> local_13f9;
  string local_13f8;
  LogNumber<float> local_13d8;
  allocator<char> local_1369;
  string local_1368;
  allocator<char> local_1341;
  string local_1340;
  allocator<char> local_1319;
  string local_1318;
  LogNumber<float> local_12f8;
  allocator<char> local_1289;
  string local_1288;
  allocator<char> local_1261;
  string local_1260;
  allocator<char> local_1239;
  string local_1238;
  LogNumber<float> local_1218;
  allocator<char> local_11a9;
  string local_11a8;
  allocator<char> local_1181;
  string local_1180;
  allocator<char> local_1159;
  string local_1158;
  LogNumber<float> local_1138;
  allocator<char> local_10c9;
  string local_10c8;
  allocator<char> local_10a1;
  string local_10a0;
  allocator<char> local_1079;
  string local_1078;
  LogNumber<float> local_1058;
  allocator<char> local_fe9;
  string local_fe8;
  allocator<char> local_fc1;
  string local_fc0;
  allocator<char> local_f99;
  string local_f98;
  LogNumber<float> local_f78;
  allocator<char> local_f09;
  string local_f08;
  allocator<char> local_ee1;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  LogNumber<float> local_e98;
  float local_e30;
  float local_e2c;
  float sampleTemporalStability;
  float sampleLinearity;
  float approximatedTransferTimeNoConstant;
  float approximatedTransferTime;
  int medianBufferSize;
  allocator<char> local_df1;
  string local_df0;
  ScopedLogSection local_dd0;
  ScopedLogSection section_3;
  string local_dc0;
  allocator<char> local_d99;
  string local_d98;
  ScopedLogSection local_d78;
  ScopedLogSection section_2;
  string local_d68;
  allocator<char> local_d41;
  string local_d40;
  allocator<char> local_d19;
  string local_d18;
  LogNumber<float> local_cf8;
  allocator<char> local_c89;
  string local_c88;
  allocator<char> local_c61;
  string local_c60;
  allocator<char> local_c39;
  string local_c38;
  LogNumber<float> local_c18;
  allocator<char> local_ba9;
  string local_ba8;
  allocator<char> local_b81;
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  LogNumber<float> local_b38;
  allocator<char> local_ac9;
  string local_ac8;
  allocator<char> local_aa1;
  string local_aa0;
  allocator<char> local_a79;
  string local_a78;
  LogNumber<float> local_a58;
  allocator<char> local_9e9;
  string local_9e8;
  allocator<char> local_9c1;
  string local_9c0;
  allocator<char> local_999;
  string local_998;
  LogNumber<float> local_978;
  allocator<char> local_909;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0;
  allocator<char> local_8b9;
  string local_8b8;
  LogNumber<float> local_898;
  allocator<char> local_829;
  string local_828;
  allocator<char> local_801;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  LogNumber<float> local_7b8;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  LogNumber<float> local_6d8;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  LogNumber<float> local_5f8;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  LogNumber<float> local_518;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  LogNumber<float> local_438;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  LogNumber<float> local_358;
  string local_2f0;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8 [39];
  allocator<char> local_281;
  string local_280;
  ScopedLogSection local_260;
  ScopedLogSection section_1;
  StatsType stats;
  int bucketRangeMax;
  int bucketRangeMin;
  int bucketNdx;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  buckets [4];
  int maxBufferSize;
  int minBufferSize;
  int numBuckets;
  allocator<char> local_111;
  string local_110;
  ScopedLogSection local_f0;
  ScopedLogSection section;
  float approximatedTransferRateNoConstant;
  float approximatedTransferRate;
  StatsType resultStats;
  LineParametersWithConfidence theilSenFitting;
  bool logBucketPerformance_local;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
  *samples_local;
  TestLog *log_local;
  UploadSampleAnalyzeResult result;
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>>
            ((LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,
             (_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)0x30,in_RCX);
  calculateSampleStatistics
            ((MapFlushCallStatistics *)&approximatedTransferRateNoConstant,
             (LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"Samples",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numBuckets,"Samples",(allocator<char> *)((long)&minBufferSize + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_f0,log,&local_110,(string *)&numBuckets);
  std::__cxx11::string::~string((string *)&numBuckets);
  std::allocator<char>::~allocator((allocator<char> *)((long)&minBufferSize + 3));
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  logSampleList(log,(LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,samples);
  tcu::ScopedLogSection::~ScopedLogSection(&local_f0);
  if (logBucketPerformance) {
    buckets[3].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    buckets[3].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    local_18e8 = (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  *)&bucketRangeMin;
    do {
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
      ::vector(local_18e8);
      local_18e8 = local_18e8 + 1;
    } while (local_18e8 !=
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              *)&buckets[3].
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bucketizeSamplesUniformly<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
              (samples,(vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                        *)&bucketRangeMin,4,
               (int *)((long)&buckets[3].
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
               (int *)&buckets[3].
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    for (bucketRangeMax = 0; bucketRangeMax < 4; bucketRangeMax = bucketRangeMax + 1) {
      bVar3 = std::
              vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
              ::empty((vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                       *)(&bucketRangeMin + (long)bucketRangeMax * 6));
      if (!bVar3) {
        uVar4 = buckets[3].
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                (int)((float)bucketRangeMax * 0.25 *
                     (float)((int)buckets[3].
                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            buckets[3].
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
        uVar5 = buckets[3].
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ +
                (int)((float)(bucketRangeMax + 1) * 0.25 *
                     (float)((int)buckets[3].
                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            buckets[3].
                            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
        calculateSampleStatistics
                  ((MapFlushCallStatistics *)&section_1,
                   (LineParametersWithConfidence *)&resultStats.max9DecileRelDiffTime,
                   (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                    *)(&bucketRangeMin + (long)bucketRangeMax * 6));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,"BufferSizeRange",&local_281);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_2a8,"Transfer performance with buffer size in range [",&local_2a9);
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_2d0,(_anonymous_namespace_ *)(ulong)uVar4,numBytes);
        auVar9 = std::__cxx11::string::append((char *)&local_2d0);
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_2f0,(_anonymous_namespace_ *)(ulong)uVar5,auVar9._8_4_);
        std::__cxx11::string::append((char *)&local_2f0);
        std::__cxx11::string::append(auVar9._0_8_);
        description = (string *)std::__cxx11::string::append(local_2a8);
        tcu::ScopedLogSection::ScopedLogSection(&local_260,log,&local_280,description);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::__cxx11::string::~string(local_2a8);
        std::allocator<char>::~allocator(&local_2a9);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
        logMapRangeStats<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                  (log,(StatsType *)&section_1);
        logUnmapStats<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                  (log,(StatsType *)&section_1);
        logWriteStats<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                  (log,(StatsType *)&section_1);
        logFlushStats<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                  (log,(StatsType *)&section_1);
        logAllocStats<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                  (log,(StatsType *)&section_1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"Min",&local_379);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a0,"Total: Min time",&local_3a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"us",&local_3c9);
        tcu::LogNumber<float>::LogNumber
                  (&local_358,&local_378,&local_3a0,&local_3c8,QP_KEY_TAG_TIME,
                   stats.alloc.min2DecileTime);
        pTVar6 = tcu::TestLog::operator<<(log,&local_358);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"Max",&local_459);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_480,"Total: Max time",&local_481);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"us",&local_4a9);
        tcu::LogNumber<float>::LogNumber
                  (&local_438,&local_458,&local_480,&local_4a8,QP_KEY_TAG_TIME,
                   stats.alloc.max9DecileTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_438);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"Min90",&local_539);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_560,"Total: 90%-Min time",&local_561);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"us",&local_589);
        tcu::LogNumber<float>::LogNumber
                  (&local_518,&local_538,&local_560,&local_588,QP_KEY_TAG_TIME,stats.result.maxTime)
        ;
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_518);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"Max90",&local_619);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_640,"Total: 90%-Max time",&local_641);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"us",&local_669);
        tcu::LogNumber<float>::LogNumber
                  (&local_5f8,&local_618,&local_640,&local_668,QP_KEY_TAG_TIME,
                   stats.result.medianTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_5f8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"Median",&local_6f9)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_720,"Total: Median time",&local_721);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"us",&local_749);
        tcu::LogNumber<float>::LogNumber
                  (&local_6d8,&local_6f8,&local_720,&local_748,QP_KEY_TAG_TIME,stats.result.minTime)
        ;
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_6d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7d8,"MedianTransfer",&local_7d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_800,"Median transfer rate",&local_801);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_828,"MB / s",&local_829)
        ;
        tcu::LogNumber<float>::LogNumber
                  (&local_7b8,&local_7d8,&local_800,&local_828,QP_KEY_TAG_PERFORMANCE,
                   stats.result.min2DecileTime * 0.0009765625 * 0.0009765625);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_7b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8b8,"MaxDiff",&local_8b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8e0,"Max difference to approximated",&local_8e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_908,"us",&local_909);
        tcu::LogNumber<float>::LogNumber
                  (&local_898,&local_8b8,&local_8e0,&local_908,QP_KEY_TAG_TIME,
                   stats.result.max9DecileTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_898);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_998,"Max90Diff",&local_999);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_9c0,"90%-Max difference to approximated",&local_9c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"us",&local_9e9);
        tcu::LogNumber<float>::LogNumber
                  (&local_978,&local_998,&local_9c0,&local_9e8,QP_KEY_TAG_TIME,stats.medianRate);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_978);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a78,"MedianDiff",&local_a79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_aa0,"Median difference to approximated",&local_aa1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac8,"us",&local_ac9);
        tcu::LogNumber<float>::LogNumber
                  (&local_a58,&local_a78,&local_aa0,&local_ac8,QP_KEY_TAG_TIME,stats.maxDiffTime);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_a58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b58,"MaxRelDiff",&local_b59);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b80,"Max relative difference to approximated",&local_b81);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba8,"%",&local_ba9);
        tcu::LogNumber<float>::LogNumber
                  (&local_b38,&local_b58,&local_b80,&local_ba8,QP_KEY_TAG_NONE,
                   stats.maxDiff9DecileTime * 100.0);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_b38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c38,"Max90RelDiff",&local_c39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c60,"90%-Max relative difference to approximated",&local_c61);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c88,"%",&local_c89);
        tcu::LogNumber<float>::LogNumber
                  (&local_c18,&local_c38,&local_c60,&local_c88,QP_KEY_TAG_NONE,
                   stats.medianDiffTime * 100.0);
        pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_c18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d18,"MedianRelDiff",&local_d19);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d40,"Median relative difference to approximated",&local_d41);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d68,"%",(allocator<char> *)((long)&section_2.m_log + 7));
        tcu::LogNumber<float>::LogNumber
                  (&local_cf8,&local_d18,&local_d40,&local_d68,QP_KEY_TAG_NONE,
                   stats.maxRelDiffTime * 100.0);
        tcu::TestLog::operator<<(pTVar6,&local_cf8);
        tcu::LogNumber<float>::~LogNumber(&local_cf8);
        std::__cxx11::string::~string((string *)&local_d68);
        std::allocator<char>::~allocator((allocator<char> *)((long)&section_2.m_log + 7));
        std::__cxx11::string::~string((string *)&local_d40);
        std::allocator<char>::~allocator(&local_d41);
        std::__cxx11::string::~string((string *)&local_d18);
        std::allocator<char>::~allocator(&local_d19);
        tcu::LogNumber<float>::~LogNumber(&local_c18);
        std::__cxx11::string::~string((string *)&local_c88);
        std::allocator<char>::~allocator(&local_c89);
        std::__cxx11::string::~string((string *)&local_c60);
        std::allocator<char>::~allocator(&local_c61);
        std::__cxx11::string::~string((string *)&local_c38);
        std::allocator<char>::~allocator(&local_c39);
        tcu::LogNumber<float>::~LogNumber(&local_b38);
        std::__cxx11::string::~string((string *)&local_ba8);
        std::allocator<char>::~allocator(&local_ba9);
        std::__cxx11::string::~string((string *)&local_b80);
        std::allocator<char>::~allocator(&local_b81);
        std::__cxx11::string::~string((string *)&local_b58);
        std::allocator<char>::~allocator(&local_b59);
        tcu::LogNumber<float>::~LogNumber(&local_a58);
        std::__cxx11::string::~string((string *)&local_ac8);
        std::allocator<char>::~allocator(&local_ac9);
        std::__cxx11::string::~string((string *)&local_aa0);
        std::allocator<char>::~allocator(&local_aa1);
        std::__cxx11::string::~string((string *)&local_a78);
        std::allocator<char>::~allocator(&local_a79);
        tcu::LogNumber<float>::~LogNumber(&local_978);
        std::__cxx11::string::~string((string *)&local_9e8);
        std::allocator<char>::~allocator(&local_9e9);
        std::__cxx11::string::~string((string *)&local_9c0);
        std::allocator<char>::~allocator(&local_9c1);
        std::__cxx11::string::~string((string *)&local_998);
        std::allocator<char>::~allocator(&local_999);
        tcu::LogNumber<float>::~LogNumber(&local_898);
        std::__cxx11::string::~string((string *)&local_908);
        std::allocator<char>::~allocator(&local_909);
        std::__cxx11::string::~string((string *)&local_8e0);
        std::allocator<char>::~allocator(&local_8e1);
        std::__cxx11::string::~string((string *)&local_8b8);
        std::allocator<char>::~allocator(&local_8b9);
        tcu::LogNumber<float>::~LogNumber(&local_7b8);
        std::__cxx11::string::~string((string *)&local_828);
        std::allocator<char>::~allocator(&local_829);
        std::__cxx11::string::~string((string *)&local_800);
        std::allocator<char>::~allocator(&local_801);
        std::__cxx11::string::~string((string *)&local_7d8);
        std::allocator<char>::~allocator(&local_7d9);
        tcu::LogNumber<float>::~LogNumber(&local_6d8);
        std::__cxx11::string::~string((string *)&local_748);
        std::allocator<char>::~allocator(&local_749);
        std::__cxx11::string::~string((string *)&local_720);
        std::allocator<char>::~allocator(&local_721);
        std::__cxx11::string::~string((string *)&local_6f8);
        std::allocator<char>::~allocator(&local_6f9);
        tcu::LogNumber<float>::~LogNumber(&local_5f8);
        std::__cxx11::string::~string((string *)&local_668);
        std::allocator<char>::~allocator(&local_669);
        std::__cxx11::string::~string((string *)&local_640);
        std::allocator<char>::~allocator(&local_641);
        std::__cxx11::string::~string((string *)&local_618);
        std::allocator<char>::~allocator(&local_619);
        tcu::LogNumber<float>::~LogNumber(&local_518);
        std::__cxx11::string::~string((string *)&local_588);
        std::allocator<char>::~allocator(&local_589);
        std::__cxx11::string::~string((string *)&local_560);
        std::allocator<char>::~allocator(&local_561);
        std::__cxx11::string::~string((string *)&local_538);
        std::allocator<char>::~allocator(&local_539);
        tcu::LogNumber<float>::~LogNumber(&local_438);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::allocator<char>::~allocator(&local_4a9);
        std::__cxx11::string::~string((string *)&local_480);
        std::allocator<char>::~allocator(&local_481);
        std::__cxx11::string::~string((string *)&local_458);
        std::allocator<char>::~allocator(&local_459);
        tcu::LogNumber<float>::~LogNumber(&local_358);
        std::__cxx11::string::~string((string *)&local_3c8);
        std::allocator<char>::~allocator(&local_3c9);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::allocator<char>::~allocator(&local_3a1);
        std::__cxx11::string::~string((string *)&local_378);
        std::allocator<char>::~allocator(&local_379);
        tcu::ScopedLogSection::~ScopedLogSection(&local_260);
      }
    }
    local_1ab8 = &buckets[3].
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_1ab8 = local_1ab8 + -3;
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
      ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
                 *)local_1ab8);
    } while (local_1ab8 != (pointer *)&bucketRangeMin);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d98,"Contribution",&local_d99)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dc0,"Contributions",(allocator<char> *)((long)&section_3.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_d78,log,&local_d98,&local_dc0);
  std::__cxx11::string::~string((string *)&local_dc0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_3.m_log + 7));
  std::__cxx11::string::~string((string *)&local_d98);
  std::allocator<char>::~allocator(&local_d99);
  logMapContribution<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
            (log,samples,(StatsType *)&approximatedTransferRateNoConstant);
  logUnmapContribution<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
            (log,samples,(StatsType *)&approximatedTransferRateNoConstant);
  logWriteContribution<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
            (log,samples,(StatsType *)&approximatedTransferRateNoConstant);
  logFlushContribution<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
            (log,samples,(StatsType *)&approximatedTransferRateNoConstant);
  logAllocContribution<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
            (log,samples,(StatsType *)&approximatedTransferRateNoConstant);
  tcu::ScopedLogSection::~ScopedLogSection(&local_d78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_df0,"Results",&local_df1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&medianBufferSize,"Results",
             (allocator<char> *)((long)&approximatedTransferTime + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_dd0,log,&local_df0,(string *)&medianBufferSize);
  std::__cxx11::string::~string((string *)&medianBufferSize);
  std::allocator<char>::~allocator((allocator<char> *)((long)&approximatedTransferTime + 3));
  std::__cxx11::string::~string((string *)&local_df0);
  std::allocator<char>::~allocator(&local_df1);
  pvVar7 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
           ::front(samples);
  iVar1 = pvVar7->bufferSize;
  pvVar7 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>_>_>
           ::back(samples);
  approximatedTransferTimeNoConstant = (float)((iVar1 + pvVar7->bufferSize) / 2);
  sampleLinearity =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedTransferTimeNoConstant +
        resultStats.max9DecileRelDiffTime) / 1000.0) / 1000.0;
  sampleTemporalStability =
       ((theilSenFitting.offsetConfidenceUpper * (float)(int)approximatedTransferTimeNoConstant) /
       1000.0) / 1000.0;
  local_e2c = calculateSampleFitLinearity<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                        (samples);
  local_e30 = calculateSampleTemporalStability<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDuration>
                        (samples);
  section.m_log._4_4_ = (float)(int)approximatedTransferTimeNoConstant / sampleTemporalStability;
  fVar8 = (float)(int)approximatedTransferTimeNoConstant / sampleLinearity;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_eb8,"ResultLinearity",&local_eb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ee0,"Sample linearity",&local_ee1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f08,"%",&local_f09);
  tcu::LogNumber<float>::LogNumber
            (&local_e98,&local_eb8,&local_ee0,&local_f08,QP_KEY_TAG_QUALITY,local_e2c * 100.0);
  pTVar6 = tcu::TestLog::operator<<(log,&local_e98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f98,"SampleTemporalStability",&local_f99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fc0,"Sample temporal stability",&local_fc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_fe8,"%",&local_fe9);
  tcu::LogNumber<float>::LogNumber
            (&local_f78,&local_f98,&local_fc0,&local_fe8,QP_KEY_TAG_QUALITY,local_e30 * 100.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_f78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1078,"ApproximatedConstantCost",&local_1079);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10a0,"Approximated contant cost",&local_10a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10c8,"us",&local_10c9);
  tcu::LogNumber<float>::LogNumber
            (&local_1058,&local_1078,&local_10a0,&local_10c8,QP_KEY_TAG_TIME,
             resultStats.max9DecileRelDiffTime);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1158,"ApproximatedConstantCostConfidence60Lower",&local_1159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1180,"Approximated contant cost 60% confidence lower limit",
             &local_1181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_11a8,"us",&local_11a9);
  tcu::LogNumber<float>::LogNumber
            (&local_1138,&local_1158,&local_1180,&local_11a8,QP_KEY_TAG_TIME,theilSenFitting.offset)
  ;
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1238,"ApproximatedConstantCostConfidence60Upper",&local_1239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1260,"Approximated contant cost 60% confidence upper limit",
             &local_1261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1288,"us",&local_1289);
  tcu::LogNumber<float>::LogNumber
            (&local_1218,&local_1238,&local_1260,&local_1288,QP_KEY_TAG_TIME,
             resultStats.medianRelDiffTime);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1318,"ApproximatedLinearCost",&local_1319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1340,"Approximated linear cost",&local_1341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1368,"us / MB",&local_1369);
  tcu::LogNumber<float>::LogNumber
            (&local_12f8,&local_1318,&local_1340,&local_1368,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper * 1024.0 * 1024.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_12f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13f8,"ApproximatedLinearCostConfidence60Lower",&local_13f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1420,"Approximated linear cost 60% confidence lower limit",&local_1421
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1448,"us / MB",&local_1449);
  tcu::LogNumber<float>::LogNumber
            (&local_13d8,&local_13f8,&local_1420,&local_1448,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_13d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14d8,"ApproximatedLinearCostConfidence60Upper",&local_14d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1500,"Approximated linear cost 60% confidence upper limit",&local_1501
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1528,"us / MB",&local_1529);
  tcu::LogNumber<float>::LogNumber
            (&local_14b8,&local_14d8,&local_1500,&local_1528,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower * 1024.0 * 1024.0);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_14b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15b8,"ApproximatedTransferRate",&local_15b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_15e0,"Approximated transfer rate",&local_15e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1608,"MB / s",&local_1609);
  tcu::LogNumber<float>::LogNumber
            (&local_1598,&local_15b8,&local_15e0,&local_1608,QP_KEY_TAG_PERFORMANCE,
             fVar8 * 0.0009765625 * 0.0009765625);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1698,"ApproximatedTransferRateNoConstant",&local_1699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_16c0,"Approximated transfer rate without constant cost",&local_16c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_16e8,"MB / s",&local_16e9);
  tcu::LogNumber<float>::LogNumber
            (&local_1678,&local_1698,&local_16c0,&local_16e8,QP_KEY_TAG_PERFORMANCE,
             section.m_log._4_4_ * 0.0009765625 * 0.0009765625);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1678);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1778,"SampleMedianTime",&local_1779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17a0,"Median sample time",&local_17a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_17c8,"us",&local_17c9);
  tcu::LogNumber<float>::LogNumber
            (&local_1758,&local_1778,&local_17a0,&local_17c8,QP_KEY_TAG_TIME,
             resultStats.result.minTime);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_1758);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1858,"SampleMedianTransfer",&local_1859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1880,"Median transfer rate",&local_1881);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_18a8,"MB / s",&local_18a9);
  tcu::LogNumber<float>::LogNumber
            (&local_1838,&local_1858,&local_1880,&local_18a8,QP_KEY_TAG_PERFORMANCE,
             resultStats.result.min2DecileTime * 0.0009765625 * 0.0009765625);
  tcu::TestLog::operator<<(pTVar6,&local_1838);
  tcu::LogNumber<float>::~LogNumber(&local_1838);
  std::__cxx11::string::~string((string *)&local_18a8);
  std::allocator<char>::~allocator(&local_18a9);
  std::__cxx11::string::~string((string *)&local_1880);
  std::allocator<char>::~allocator(&local_1881);
  std::__cxx11::string::~string((string *)&local_1858);
  std::allocator<char>::~allocator(&local_1859);
  tcu::LogNumber<float>::~LogNumber(&local_1758);
  std::__cxx11::string::~string((string *)&local_17c8);
  std::allocator<char>::~allocator(&local_17c9);
  std::__cxx11::string::~string((string *)&local_17a0);
  std::allocator<char>::~allocator(&local_17a1);
  std::__cxx11::string::~string((string *)&local_1778);
  std::allocator<char>::~allocator(&local_1779);
  tcu::LogNumber<float>::~LogNumber(&local_1678);
  std::__cxx11::string::~string((string *)&local_16e8);
  std::allocator<char>::~allocator(&local_16e9);
  std::__cxx11::string::~string((string *)&local_16c0);
  std::allocator<char>::~allocator(&local_16c1);
  std::__cxx11::string::~string((string *)&local_1698);
  std::allocator<char>::~allocator(&local_1699);
  tcu::LogNumber<float>::~LogNumber(&local_1598);
  std::__cxx11::string::~string((string *)&local_1608);
  std::allocator<char>::~allocator(&local_1609);
  std::__cxx11::string::~string((string *)&local_15e0);
  std::allocator<char>::~allocator(&local_15e1);
  std::__cxx11::string::~string((string *)&local_15b8);
  std::allocator<char>::~allocator(&local_15b9);
  tcu::LogNumber<float>::~LogNumber(&local_14b8);
  std::__cxx11::string::~string((string *)&local_1528);
  std::allocator<char>::~allocator(&local_1529);
  std::__cxx11::string::~string((string *)&local_1500);
  std::allocator<char>::~allocator(&local_1501);
  std::__cxx11::string::~string((string *)&local_14d8);
  std::allocator<char>::~allocator(&local_14d9);
  tcu::LogNumber<float>::~LogNumber(&local_13d8);
  std::__cxx11::string::~string((string *)&local_1448);
  std::allocator<char>::~allocator(&local_1449);
  std::__cxx11::string::~string((string *)&local_1420);
  std::allocator<char>::~allocator(&local_1421);
  std::__cxx11::string::~string((string *)&local_13f8);
  std::allocator<char>::~allocator(&local_13f9);
  tcu::LogNumber<float>::~LogNumber(&local_12f8);
  std::__cxx11::string::~string((string *)&local_1368);
  std::allocator<char>::~allocator(&local_1369);
  std::__cxx11::string::~string((string *)&local_1340);
  std::allocator<char>::~allocator(&local_1341);
  std::__cxx11::string::~string((string *)&local_1318);
  std::allocator<char>::~allocator(&local_1319);
  tcu::LogNumber<float>::~LogNumber(&local_1218);
  std::__cxx11::string::~string((string *)&local_1288);
  std::allocator<char>::~allocator(&local_1289);
  std::__cxx11::string::~string((string *)&local_1260);
  std::allocator<char>::~allocator(&local_1261);
  std::__cxx11::string::~string((string *)&local_1238);
  std::allocator<char>::~allocator(&local_1239);
  tcu::LogNumber<float>::~LogNumber(&local_1138);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::allocator<char>::~allocator(&local_11a9);
  std::__cxx11::string::~string((string *)&local_1180);
  std::allocator<char>::~allocator(&local_1181);
  std::__cxx11::string::~string((string *)&local_1158);
  std::allocator<char>::~allocator(&local_1159);
  tcu::LogNumber<float>::~LogNumber(&local_1058);
  std::__cxx11::string::~string((string *)&local_10c8);
  std::allocator<char>::~allocator(&local_10c9);
  std::__cxx11::string::~string((string *)&local_10a0);
  std::allocator<char>::~allocator(&local_10a1);
  std::__cxx11::string::~string((string *)&local_1078);
  std::allocator<char>::~allocator(&local_1079);
  tcu::LogNumber<float>::~LogNumber(&local_f78);
  std::__cxx11::string::~string((string *)&local_fe8);
  std::allocator<char>::~allocator(&local_fe9);
  std::__cxx11::string::~string((string *)&local_fc0);
  std::allocator<char>::~allocator(&local_fc1);
  std::__cxx11::string::~string((string *)&local_f98);
  std::allocator<char>::~allocator(&local_f99);
  tcu::LogNumber<float>::~LogNumber(&local_e98);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator(&local_f09);
  std::__cxx11::string::~string((string *)&local_ee0);
  std::allocator<char>::~allocator(&local_ee1);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator(&local_eb9);
  tcu::ScopedLogSection::~ScopedLogSection(&local_dd0);
  UVar2.transferRateAtRange = fVar8;
  UVar2.transferRateMedian = resultStats.result.min2DecileTime;
  UVar2.transferRateAtInfinity = section.m_log._4_4_;
  return UVar2;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}